

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O1

void __thiscall
ot::commissioner::CommissionerImpl::GetCommissionerDataset
          (CommissionerImpl *this,Handler<CommissionerDataset> *aHandler,uint16_t aDatasetFlags)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined4 uVar2;
  type tVar3;
  function<void_(const_ot::commissioner::CommissionerDataset_*,_ot::commissioner::Error)> *this_00;
  char *pcVar4;
  char *begin;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  ByteArray tlvTypes;
  Error error;
  anon_class_32_1_d0c21527 onResponse;
  Request request;
  string local_1d8;
  undefined1 local_1b8 [8];
  _Alloc_hider local_1b0;
  size_t local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  parse_func local_190 [1];
  _Any_data local_188;
  code *local_178;
  code *pcStack_170;
  ByteArray local_160;
  type local_148;
  undefined1 *local_140;
  long local_138;
  undefined1 local_130 [16];
  _Any_data local_120;
  code *local_110;
  undefined1 local_100 [8];
  _Alloc_hider local_f8;
  char local_e8 [16];
  string local_d8;
  Message local_b8;
  
  local_140 = local_130;
  local_148 = 0;
  local_138 = 0;
  local_130[0] = 0;
  coap::Message::Message(&local_b8,kConfirmable,kPost);
  GetCommissionerDatasetTlvs(&local_160,aDatasetFlags);
  std::function<void_(const_ot::commissioner::CommissionerDataset_*,_ot::commissioner::Error)>::
  function((function<void_(const_ot::commissioner::CommissionerDataset_*,_ot::commissioner::Error)>
            *)&local_120,aHandler);
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"/c/cg","");
  coap::Message::SetUriPath((Error *)local_1b8,&local_b8,&local_1d8);
  local_148 = local_1b8._0_4_;
  std::__cxx11::string::operator=((string *)&local_140,(string *)&local_1b0);
  tVar3 = local_148;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_p != &local_1a0) {
    operator_delete(local_1b0._M_p);
  }
  paVar1 = &local_1d8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  if (tVar3 == none_type) {
    if (local_160.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_160.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      tlv::Tlv::Tlv((Tlv *)&local_1d8,kGet,&local_160,kMeshCoP);
      AppendTlv((Error *)local_1b8,&local_b8,(Tlv *)&local_1d8);
      uVar2 = local_1b8._0_4_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_p != &local_1a0) {
        operator_delete(local_1b0._M_p);
      }
      if ((void *)local_1d8._M_string_length != (void *)0x0) {
        operator_delete((void *)local_1d8._M_string_length);
      }
      if (uVar2 != none_type) goto LAB_00196883;
    }
    local_178 = (code *)0x0;
    pcStack_170 = (code *)0x0;
    local_188._M_unused._M_object = (void *)0x0;
    local_188._8_8_ = 0;
    this_00 = (function<void_(const_ot::commissioner::CommissionerDataset_*,_ot::commissioner::Error)>
               *)operator_new(0x20);
    std::function<void_(const_ot::commissioner::CommissionerDataset_*,_ot::commissioner::Error)>::
    function(this_00,(function<void_(const_ot::commissioner::CommissionerDataset_*,_ot::commissioner::Error)>
                      *)&local_120);
    pcStack_170 = std::
                  _Function_handler<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp:379:23)>
                  ::_M_invoke;
    local_178 = std::
                _Function_handler<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp:379:23)>
                ::_M_manager;
    local_188._M_unused._M_object = this_00;
    ProxyClient::SendRequest
              (&this->mProxyClient,&local_b8,(ResponseHandler *)&local_188,0xfc00,0xf0bf);
    if (local_178 != (code *)0x0) {
      (*local_178)(&local_188,&local_188,__destroy_functor);
    }
    local_1d8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"mgmt","");
    local_1b8 = (undefined1  [8])((ulong)(uint)local_1b8._4_4_ << 0x20);
    local_1b0._M_p = "sent MGMT_COMMISSIONER_GET.req";
    local_1a8 = 0x1e;
    local_1a0._M_allocated_capacity = 0;
    local_190[0] = (parse_func)0x0;
    begin = "sent MGMT_COMMISSIONER_GET.req";
    local_1a0._8_8_ = (format_string_checker<char> *)local_1b8;
    do {
      pcVar4 = begin + 1;
      if (*begin == '}') {
        if ((pcVar4 == "") || (*pcVar4 != '}')) {
          fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar4 = begin + 2;
      }
      else if (*begin == '{') {
        pcVar4 = fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (begin,"",(format_string_checker<char> *)local_1b8);
      }
      begin = pcVar4;
    } while (pcVar4 != "");
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_1b8;
    fmt::v10::vformat_abi_cxx11_
              (&local_d8,(v10 *)"sent MGMT_COMMISSIONER_GET.req",(string_view)ZEXT816(0x1e),args);
    Log(kDebug,&local_1d8,&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
  }
LAB_00196883:
  if (local_148 != none_type) {
    local_100._0_4_ = local_148;
    local_f8._M_p = local_e8;
    std::__cxx11::string::_M_construct<char*>((string *)&local_f8,local_140,local_140 + local_138);
    local_1b8 = (undefined1  [8])0x0;
    if ((aHandler->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*aHandler->_M_invoker)
              ((_Any_data *)aHandler,(CommissionerDataset **)local_1b8,(Error *)local_100);
    if (local_f8._M_p != local_e8) {
      operator_delete(local_f8._M_p);
    }
  }
  if (local_110 != (code *)0x0) {
    (*local_110)(&local_120,&local_120,__destroy_functor);
  }
  if (local_160.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_160.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.mRequestUri._M_dataplus._M_p != &local_b8.mRequestUri.field_2) {
    operator_delete(local_b8.mRequestUri._M_dataplus._M_p);
  }
  if (local_b8.mPayload.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.mPayload.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<ot::commissioner::coap::OptionType,_std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>,_std::_Select1st<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>,_std::less<ot::commissioner::coap::OptionType>,_std::allocator<std::pair<const_ot::commissioner::coap::OptionType,_ot::commissioner::coap::OptionValue>_>_>
  ::~_Rb_tree(&local_b8.mOptions._M_t);
  if (local_140 != local_130) {
    operator_delete(local_140);
  }
  return;
}

Assistant:

void CommissionerImpl::GetCommissionerDataset(Handler<CommissionerDataset> aHandler, uint16_t aDatasetFlags)
{
    Error         error;
    coap::Request request{coap::Type::kConfirmable, coap::Code::kPost};
    ByteArray     tlvTypes = GetCommissionerDatasetTlvs(aDatasetFlags);

    auto onResponse = [aHandler](const coap::Response *aResponse, Error aError) {
        Error               error;
        CommissionerDataset dataset;

        SuccessOrExit(error = aError);
        SuccessOrExit(error = CheckCoapResponseCode(*aResponse));

        SuccessOrExit(error = DecodeCommissionerDataset(dataset, *aResponse));

        aHandler(&dataset, error);

    exit:
        if (error != ErrorCode::kNone)
        {
            aHandler(nullptr, error);
        }
    };

    SuccessOrExit(error = request.SetUriPath(uri::kMgmtCommissionerGet));

    // If Get TLV is not present, get all Commissioner Dataset TLVs.
    if (!tlvTypes.empty())
    {
        SuccessOrExit(AppendTlv(request, {tlv::Type::kGet, tlvTypes}));
    }

    mProxyClient.SendRequest(request, onResponse, kLeaderAloc16, kDefaultMmPort);

    LOG_DEBUG(LOG_REGION_MGMT, "sent MGMT_COMMISSIONER_GET.req");

exit:
    if (error != ErrorCode::kNone)
    {
        aHandler(nullptr, error);
    }
}